

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ConcatString3(JSContext *ctx,char *str1,JSValue str2,char *str3)

{
  JSValue v;
  JSValue v_00;
  JSValueUnion JVar1;
  int iVar2;
  int in_ECX;
  JSValueUnion in_RDX;
  char *in_RSI;
  char *in_R8;
  JSValue JVar3;
  JSString *p;
  int len3;
  int len1;
  StringBuffer *b;
  StringBuffer b_s;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  JSValueUnion in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  JSValueUnion local_20;
  undefined1 local_10 [8];
  int64_t local_8;
  
  JVar1 = in_RDX;
  if (in_ECX != -7) {
    JVar3.tag._0_4_ = in_stack_ffffffffffffff98;
    JVar3.u.ptr = in_stack_ffffffffffffff90.ptr;
    JVar3.tag._4_4_ = in_stack_ffffffffffffff9c;
    JVar3 = JS_ToStringFree((JSContext *)in_stack_ffffffffffffff88.ptr,JVar3);
    in_stack_ffffffffffffff88 = (JSValueUnion)JVar3.tag;
    in_stack_ffffffffffffff80 = JVar3.u;
    iVar2 = JS_IsException(JVar3);
    local_20 = in_stack_ffffffffffffff90;
    JVar1 = JVar3.u;
    if (iVar2 != 0) goto LAB_00166da1;
  }
  local_20 = JVar1;
  strlen(in_RSI);
  strlen(in_R8);
  iVar2 = string_buffer_init2((JSContext *)in_stack_ffffffffffffff88.ptr,
                              (StringBuffer *)in_stack_ffffffffffffff80.ptr,
                              in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  if (iVar2 == 0) {
    string_buffer_write8
              ((StringBuffer *)in_stack_ffffffffffffff88.ptr,
               (uint8_t *)in_stack_ffffffffffffff80.ptr,in_stack_ffffffffffffff7c);
    string_buffer_concat
              ((StringBuffer *)in_stack_ffffffffffffff88.ptr,
               (JSString *)in_stack_ffffffffffffff80.ptr,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78);
    string_buffer_write8
              ((StringBuffer *)in_stack_ffffffffffffff88.ptr,
               (uint8_t *)in_stack_ffffffffffffff80.ptr,in_stack_ffffffffffffff7c);
    v.tag = (int64_t)local_20.ptr;
    v.u.ptr = in_stack_ffffffffffffff88.ptr;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff80.ptr,v);
    JVar3 = string_buffer_end((StringBuffer *)in_stack_ffffffffffffff80.ptr);
    return JVar3;
  }
LAB_00166da1:
  v_00.tag = (int64_t)local_20.ptr;
  v_00.u.ptr = in_stack_ffffffffffffff88.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff80.ptr,v_00);
  local_10 = (undefined1  [8])(stack0xfffffffffffffff4 << 0x20);
  local_8 = 6;
  return _local_10;
}

Assistant:

static JSValue JS_ConcatString3(JSContext *ctx, const char *str1,
                                JSValue str2, const char *str3)
{
    StringBuffer b_s, *b = &b_s;
    int len1, len3;
    JSString *p;

    if (unlikely(JS_VALUE_GET_TAG(str2) != JS_TAG_STRING)) {
        str2 = JS_ToStringFree(ctx, str2);
        if (JS_IsException(str2))
            goto fail;
    }
    p = JS_VALUE_GET_STRING(str2);
    len1 = strlen(str1);
    len3 = strlen(str3);

    if (string_buffer_init2(ctx, b, len1 + p->len + len3, p->is_wide_char))
        goto fail;

    string_buffer_write8(b, (const uint8_t *)str1, len1);
    string_buffer_concat(b, p, 0, p->len);
    string_buffer_write8(b, (const uint8_t *)str3, len3);

    JS_FreeValue(ctx, str2);
    return string_buffer_end(b);

 fail:
    JS_FreeValue(ctx, str2);
    return JS_EXCEPTION;
}